

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world_rom_writer.cpp
# Opt level: O0

void write_custom_map_updates(World *world,ROM *rom)

{
  size_t *this;
  initializer_list<md::AddressRegister> __l;
  initializer_list<md::DataRegister> __l_00;
  initializer_list<md::AddressRegister> __l_01;
  initializer_list<md::DataRegister> __l_02;
  pointer puVar1;
  bool bVar2;
  uint32_t uVar3;
  map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
  *this_00;
  Code *pCVar4;
  Code local_6c8;
  allocator<char> local_649;
  string local_648;
  uint32_t local_624;
  undefined1 local_620 [4];
  uint32_t pause_hook_addr;
  Code pause_hook_func;
  Code local_528;
  allocator<char> local_4a1;
  string local_4a0;
  uint32_t local_480;
  allocator<md::AddressRegister> local_479;
  uint32_t reading_func_addr;
  iterator local_468;
  size_type local_460;
  vector<md::AddressRegister,_std::allocator<md::AddressRegister>_> local_458;
  allocator<md::DataRegister> local_439;
  DataRegister local_438;
  DataRegister local_428;
  iterator local_418;
  size_type local_410;
  vector<md::DataRegister,_std::allocator<md::DataRegister>_> local_408;
  allocator<char> local_3e9;
  string local_3e8;
  Param local_3c8 [2];
  allocator<char> local_3b1;
  string local_3b0;
  allocator<char> local_389;
  string local_388;
  Param local_368 [2];
  Param local_358 [2];
  AddressRegister local_348;
  AddressInRegister local_338;
  Param local_318 [2];
  allocator<char> local_301;
  string local_300;
  allocator<char> local_2d9;
  string local_2d8;
  Register local_2b8;
  allocator<char> local_2a1;
  string local_2a0;
  DataRegister local_280;
  DataRegister local_270;
  allocator<char> local_259;
  string local_258;
  DataRegister local_238;
  AddressRegister local_228;
  AddressInRegister local_218;
  allocator<char> local_1f1;
  string local_1f0;
  DataRegister local_1d0;
  Param local_1c0 [2];
  AddressRegister local_1b0;
  allocator<md::AddressRegister> local_199;
  AddressRegister local_198;
  iterator local_188;
  size_type local_180;
  vector<md::AddressRegister,_std::allocator<md::AddressRegister>_> local_178;
  allocator<md::DataRegister> local_159;
  DataRegister local_158;
  DataRegister local_148;
  iterator local_138;
  size_type local_130;
  vector<md::DataRegister,_std::allocator<md::DataRegister>_> local_128;
  undefined1 local_110 [8];
  Code func;
  string local_90;
  uint32_t local_70;
  uint32_t map_update_table_addr;
  type *local_60;
  type *map;
  type *map_id;
  _Self local_48;
  const_iterator __end1;
  const_iterator __begin1;
  map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
  *__range1;
  ByteArray custom_map_update_bytes;
  ROM *rom_local;
  World *world_local;
  
  custom_map_update_bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = &rom->_was_open;
  ByteArray::ByteArray((ByteArray *)&__range1);
  this_00 = World::maps(world);
  __end1 = std::
           map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
           ::begin(this_00);
  local_48._M_node =
       (_Base_ptr)
       std::
       map<unsigned_short,_Map_*,_std::less<unsigned_short>,_std::allocator<std::pair<const_unsigned_short,_Map_*>_>_>
       ::end(this_00);
  while (bVar2 = std::operator==(&__end1,&local_48), ((bVar2 ^ 0xffU) & 1) != 0) {
    map_id = &std::_Rb_tree_const_iterator<std::pair<const_unsigned_short,_Map_*>_>::operator*
                        (&__end1)->first;
    map = (type *)std::get<0ul,unsigned_short_const,Map*>
                            ((pair<const_unsigned_short,_Map_*> *)map_id);
    local_60 = std::get<1ul,unsigned_short_const,Map*>((pair<const_unsigned_short,_Map_*> *)map_id);
    uVar3 = Map::map_update_addr(*local_60);
    if (uVar3 != 0xffffffff) {
      ByteArray::add_word((ByteArray *)&__range1,*(uint16_t *)map);
      uVar3 = Map::map_update_addr(*local_60);
      ByteArray::add_long((ByteArray *)&__range1,uVar3);
    }
    std::_Rb_tree_const_iterator<std::pair<const_unsigned_short,_Map_*>_>::operator++(&__end1);
  }
  ByteArray::add_word((ByteArray *)&__range1,0xffff);
  puVar1 = custom_map_update_bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_90,"",
             (allocator<char> *)
             ((long)&func._labels._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
  uVar3 = md::ROM::inject_bytes
                    ((ROM *)puVar1,
                     (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&__range1,&local_90);
  std::__cxx11::string::~string((string *)&local_90);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&func._labels._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
  local_70 = uVar3;
  md::Code::Code((Code *)local_110);
  md::DataRegister::DataRegister(&local_158,'\0');
  md::DataRegister::DataRegister(&local_148,'\x01');
  local_138 = &local_158;
  local_130 = 2;
  std::allocator<md::DataRegister>::allocator(&local_159);
  __l_02._M_len = local_130;
  __l_02._M_array = local_138;
  std::vector<md::DataRegister,_std::allocator<md::DataRegister>_>::vector
            (&local_128,__l_02,&local_159);
  md::AddressRegister::AddressRegister(&local_198,'\0');
  local_188 = &local_198;
  local_180 = 1;
  std::allocator<md::AddressRegister>::allocator(&local_199);
  __l_01._M_len = local_180;
  __l_01._M_array = local_188;
  std::vector<md::AddressRegister,_std::allocator<md::AddressRegister>_>::vector
            (&local_178,__l_01,&local_199);
  md::Code::movem_to_stack((Code *)local_110,&local_128,&local_178);
  std::vector<md::AddressRegister,_std::allocator<md::AddressRegister>_>::~vector(&local_178);
  std::allocator<md::AddressRegister>::~allocator(&local_199);
  std::vector<md::DataRegister,_std::allocator<md::DataRegister>_>::~vector(&local_128);
  std::allocator<md::DataRegister>::~allocator(&local_159);
  uVar3 = local_70;
  md::AddressRegister::AddressRegister(&local_1b0,'\0');
  md::Code::lea((Code *)local_110,uVar3,&local_1b0);
  addr_<void>((uint32_t)local_1c0,0xff1204);
  md::DataRegister::DataRegister(&local_1d0,'\0');
  md::Code::movew((Code *)local_110,local_1c0,(Param *)&local_1d0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1f0,"loop",&local_1f1);
  md::Code::label((Code *)local_110,&local_1f0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::allocator<char>::~allocator(&local_1f1);
  md::AddressRegister::AddressRegister(&local_228,'\0');
  addr_postinc_<void>(&local_218,&local_228);
  md::DataRegister::DataRegister(&local_238,'\x01');
  md::Code::movew((Code *)local_110,&local_218.super_Param,(Param *)&local_238);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_258,"not_found",&local_259);
  md::Code::bmi((Code *)local_110,&local_258);
  std::__cxx11::string::~string((string *)&local_258);
  std::allocator<char>::~allocator(&local_259);
  md::DataRegister::DataRegister(&local_270,'\0');
  md::DataRegister::DataRegister(&local_280,'\x01');
  md::Code::cmpw((Code *)local_110,(Param *)&local_270,&local_280);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a0,"found",&local_2a1);
  md::Code::beq((Code *)local_110,&local_2a0);
  std::__cxx11::string::~string((string *)&local_2a0);
  std::allocator<char>::~allocator(&local_2a1);
  md::AddressRegister::AddressRegister((AddressRegister *)&local_2b8,'\0');
  md::Code::addql((Code *)local_110,'\x04',&local_2b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2d8,"loop",&local_2d9);
  md::Code::bra((Code *)local_110,&local_2d8);
  std::__cxx11::string::~string((string *)&local_2d8);
  std::allocator<char>::~allocator(&local_2d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_300,"found",&local_301);
  md::Code::label((Code *)local_110,&local_300);
  std::__cxx11::string::~string((string *)&local_300);
  std::allocator<char>::~allocator(&local_301);
  addr_<void>((uint32_t)local_318,0xff0012);
  md::Code::movew((Code *)local_110,0x4ef9,local_318);
  md::AddressRegister::AddressRegister(&local_348,'\0');
  addr_<void>(&local_338,&local_348);
  addr_<void>((uint32_t)local_358,0xff0014);
  md::Code::movel((Code *)local_110,&local_338.super_Param,local_358);
  addr_<void>((uint32_t)local_368,0xff0012);
  md::Code::jsr((Code *)local_110,local_368);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_388,"ret",&local_389);
  md::Code::bra((Code *)local_110,&local_388);
  std::__cxx11::string::~string((string *)&local_388);
  std::allocator<char>::~allocator(&local_389);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3b0,"not_found",&local_3b1);
  md::Code::label((Code *)local_110,&local_3b0);
  std::__cxx11::string::~string((string *)&local_3b0);
  std::allocator<char>::~allocator(&local_3b1);
  addr_<void>((uint32_t)local_3c8,0xff0012);
  md::Code::movew((Code *)local_110,0x4e75,local_3c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3e8,"ret",&local_3e9);
  md::Code::label((Code *)local_110,&local_3e8);
  std::__cxx11::string::~string((string *)&local_3e8);
  std::allocator<char>::~allocator(&local_3e9);
  md::DataRegister::DataRegister(&local_438,'\0');
  md::DataRegister::DataRegister(&local_428,'\x01');
  local_418 = &local_438;
  local_410 = 2;
  std::allocator<md::DataRegister>::allocator(&local_439);
  __l_00._M_len = local_410;
  __l_00._M_array = local_418;
  std::vector<md::DataRegister,_std::allocator<md::DataRegister>_>::vector
            (&local_408,__l_00,&local_439);
  md::AddressRegister::AddressRegister((AddressRegister *)&reading_func_addr,'\0');
  local_468 = (iterator)&reading_func_addr;
  local_460 = 1;
  std::allocator<md::AddressRegister>::allocator(&local_479);
  __l._M_len = local_460;
  __l._M_array = local_468;
  std::vector<md::AddressRegister,_std::allocator<md::AddressRegister>_>::vector
            (&local_458,__l,&local_479);
  md::Code::movem_from_stack((Code *)local_110,&local_408,&local_458);
  std::vector<md::AddressRegister,_std::allocator<md::AddressRegister>_>::~vector(&local_458);
  std::allocator<md::AddressRegister>::~allocator(&local_479);
  std::vector<md::DataRegister,_std::allocator<md::DataRegister>_>::~vector(&local_408);
  std::allocator<md::DataRegister>::~allocator(&local_439);
  md::Code::jmp((Code *)local_110,0x10388);
  md::Code::rts((Code *)local_110);
  puVar1 = custom_map_update_bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4a0,"",&local_4a1);
  uVar3 = md::ROM::inject_code((ROM *)puVar1,(Code *)local_110,&local_4a0);
  std::__cxx11::string::~string((string *)&local_4a0);
  std::allocator<char>::~allocator(&local_4a1);
  puVar1 = custom_map_update_bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  local_528._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_528._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_528._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_528._labels._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_528._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_528._pending_branches._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_528._labels._M_t._M_impl._0_8_ = 0;
  local_528._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_528._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0
  ;
  local_528._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_528._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_528._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  local_528._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_528._pending_branches._M_t._M_impl._0_8_ = 0;
  local_528._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_528._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_528._labels._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_480 = uVar3;
  md::Code::Code(&local_528);
  pCVar4 = md::Code::jsr(&local_528,local_480);
  md::ROM::set_code((ROM *)puVar1,0x285e,pCVar4);
  md::Code::~Code(&local_528);
  puVar1 = custom_map_update_bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  pause_hook_func._labels._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this = &pause_hook_func._labels._M_t._M_impl.super__Rb_tree_header._M_node_count;
  md::Code::Code((Code *)this);
  pCVar4 = md::Code::jsr((Code *)this,0xff0012);
  pCVar4 = md::Code::nop(pCVar4,3);
  md::ROM::set_code((ROM *)puVar1,0x1758,pCVar4);
  md::Code::~Code((Code *)&pause_hook_func._labels._M_t._M_impl.super__Rb_tree_header._M_node_count)
  ;
  md::Code::Code((Code *)local_620);
  md::Code::jsr((Code *)local_620,0x2b4e);
  md::Code::jsr((Code *)local_620,0xff0012);
  md::Code::jsr((Code *)local_620,0xba4);
  md::Code::rts((Code *)local_620);
  puVar1 = custom_map_update_bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_648,"",&local_649);
  uVar3 = md::ROM::inject_code((ROM *)puVar1,(Code *)local_620,&local_648);
  std::__cxx11::string::~string((string *)&local_648);
  std::allocator<char>::~allocator(&local_649);
  puVar1 = custom_map_update_bytes.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  local_6c8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_6c8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_6c8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_6c8._labels._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_6c8._labels._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_6c8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_6c8._labels._M_t._M_impl._0_8_ = 0;
  local_6c8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_6c8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0
  ;
  local_6c8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_6c8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  local_6c8._pending_branches._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  local_6c8._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_6c8._pending_branches._M_t._M_impl._0_8_ = 0;
  local_6c8._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_6c8._bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_6c8._labels._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_624 = uVar3;
  md::Code::Code(&local_6c8);
  pCVar4 = md::Code::jsr(&local_6c8,local_624);
  pCVar4 = md::Code::nop(pCVar4,1);
  md::ROM::set_code((ROM *)puVar1,0x29cc,pCVar4);
  md::Code::~Code(&local_6c8);
  md::Code::~Code((Code *)local_620);
  md::Code::~Code((Code *)local_110);
  ByteArray::~ByteArray((ByteArray *)&__range1);
  return;
}

Assistant:

static void write_custom_map_updates(const World& world, md::ROM& rom)
{
    ByteArray custom_map_update_bytes;
    for(const auto& [map_id, map] : world.maps())
    {
        if(map->map_update_addr() == 0xFFFFFFFF)
            continue;

        custom_map_update_bytes.add_word(map_id);
        custom_map_update_bytes.add_long(map->map_update_addr());
    }
    custom_map_update_bytes.add_word(0xFFFF);

    uint32_t map_update_table_addr = rom.inject_bytes(custom_map_update_bytes);

    // Inject a function capable of reading that table
    md::Code func;
    func.movem_to_stack({ reg_D0, reg_D1 }, { reg_A0 });
    {
        func.lea(map_update_table_addr, reg_A0);    // Setup the table cursor in A0
        func.movew(addr_(0xFF1204), reg_D0);        // Store current map ID in D0
        func.label("loop");
        {
            func.movew(addr_postinc_(reg_A0), reg_D1);  // Read map ID from table
            func.bmi("not_found");                      // If it was 0xFFFF, it means we reached table end
            func.cmpw(reg_D0, reg_D1);                  // If it matches with current map ID, jump to "found"
            func.beq("found");
            func.addql(4, reg_A0);                      // Otherwise, go to next table element
        }
        func.bra("loop");

        func.label("found");
        {
            func.movew(0x4EF9, addr_(0xFF0012));            // Put a JMP opcode at FF0012
            func.movel(addr_(reg_A0), addr_(0xFF0014));     // Put the address of the update handler where to jump
            // Run the update handler once to potentially alter map before initial display
            func.jsr(addr_(0xFF0012));
            func.bra("ret");
        }
        func.label("not_found");
        {
            func.movew(0x4E75, addr_(0xFF0012)); // Put a RET opcode at FF0012
        }
    }
    func.label("ret");
    func.movem_from_stack({ reg_D0, reg_D1 }, { reg_A0 });
    func.jmp(0x10388);  // Call the function that was erased by the injection
    func.rts();

    uint32_t reading_func_addr = rom.inject_code(func);
    // On map loading, call that function to load a potential map update handler
    rom.set_code(0x285E, md::Code().jsr(reading_func_addr));

    // On every frame, execute the map update function stored in FF0012
    rom.set_code(0x1758, md::Code().jsr(0xFF0012).nop(3));

    // When leaving pause, execute the map update function once to potentially alter map before initial display
    md::Code pause_hook_func;
    {
        pause_hook_func.jsr(0x2B4E);   // LoadRoomParams
        pause_hook_func.jsr(0xFF0012); // Update handler
        pause_hook_func.jsr(0xBA4);    // FlushDMACopyQueue
    }
    pause_hook_func.rts();
    uint32_t pause_hook_addr = rom.inject_code(pause_hook_func);
    rom.set_code(0x29CC, md::Code().jsr(pause_hook_addr).nop());
}